

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voice_detection_impl.cc
# Opt level: O1

int __thiscall webrtc::VoiceDetectionImpl::set_frame_size_ms(VoiceDetectionImpl *this,int size)

{
  string *result;
  CritScope cs;
  int local_194;
  CritScope local_190;
  FatalMessage local_188;
  
  rtc::CritScope::CritScope(&local_190,this->crit_);
  local_188.stream_ = (ostringstream)0xa;
  local_188._1_3_ = 0;
  local_194 = size;
  if (size == 10) {
    result = (string *)0x0;
  }
  else {
    result = rtc::MakeCheckOpString<int,int>((int *)&local_188,&local_194,"10 == size");
  }
  if (result == (string *)0x0) {
    this->frame_size_ms_ = size;
    Initialize(this,this->sample_rate_hz_);
    rtc::CritScope::~CritScope(&local_190);
    return 0;
  }
  rtc::FatalMessage::FatalMessage
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/voice_detection_impl.cc"
             ,0x90,result);
  rtc::FatalMessage::~FatalMessage(&local_188);
}

Assistant:

int VoiceDetectionImpl::set_frame_size_ms(int size) {
  rtc::CritScope cs(crit_);
  RTC_DCHECK_EQ(10, size); // TODO(ajm): remove when supported.
  frame_size_ms_ = size;
  Initialize(sample_rate_hz_);
  return AudioProcessing::kNoError;
}